

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int streamProcessTest(char *filename,char *result,char *err,xmlTextReaderPtr reader,char *rng,
                     int options)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  long lVar5;
  xmlTextReaderPtr pxVar6;
  undefined4 in_register_0000008c;
  undefined8 uVar7;
  char cVar8;
  bool bVar9;
  undefined8 uStack_160;
  undefined1 *puStack_158;
  undefined1 *puStack_150;
  undefined1 auStack_140 [24];
  xmlTextReaderPtr pxStack_128;
  char *pcStack_120;
  undefined8 uStack_118;
  undefined8 uStack_88;
  xmlTextReaderPtr pxStack_80;
  undefined4 local_78;
  undefined1 auStack_70 [15];
  char local_61;
  char *local_60;
  char *local_58;
  char *local_50;
  uint local_44;
  char *local_40;
  char *local_38;
  
  uVar7 = CONCAT44(in_register_0000008c,options);
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  nb_tests = nb_tests + 1;
  local_58 = filename;
  local_50 = rng;
  local_40 = result;
  local_38 = err;
  if (result == (char *)0x0) {
    local_60 = (char *)0x0;
    __stream = (FILE *)0x0;
  }
  else {
    pxStack_80 = (xmlTextReaderPtr)0x10b273;
    pxVar6 = reader;
    pcVar4 = temp_directory;
    local_60 = resultFilename(filename,temp_directory,".res");
    if (local_60 == (char *)0x0) {
      pxStack_80 = (xmlTextReaderPtr)testErrorHandler;
      streamProcessTest_cold_2();
      uStack_88 = 0xffffffff;
      iVar1 = testErrorsSize;
      if ((long)testErrorsSize < 0x8000) {
        puStack_150 = auStack_140;
        puStack_158 = auStack_70;
        uStack_160 = 0x3000000010;
        pxStack_128 = pxVar6;
        pcStack_120 = rng;
        uStack_118 = uVar7;
        pxStack_80 = reader;
        iVar1 = vsnprintf(testErrors + testErrorsSize,(ulong)(0x8000 - testErrorsSize),pcVar4,
                          &uStack_160);
        iVar1 = iVar1 + testErrorsSize;
        if (0x7fff < iVar1) {
          testErrors[0x8000] = '\0';
          iVar1 = 0x8000;
        }
        testErrorsSize = iVar1;
        testErrors[iVar1] = '\0';
      }
      return iVar1;
    }
    pxStack_80 = (xmlTextReaderPtr)0x10b290;
    __stream = fopen64(local_60,"wb");
    if (__stream == (FILE *)0x0) {
      pxStack_80 = (xmlTextReaderPtr)0x10b499;
      streamProcessTest_cold_1();
      return -1;
    }
  }
  if (local_50 != (char *)0x0) {
    pxStack_80 = (xmlTextReaderPtr)0x10b2bf;
    pxVar6 = reader;
    iVar1 = xmlTextReaderRelaxNGValidate(reader,local_50);
    if (iVar1 < 0) {
      pxStack_80 = (xmlTextReaderPtr)0x10b46b;
      testErrorHandler(pxVar6,"Relax-NG schema %s failed to compile\n",local_50);
      pxStack_80 = (xmlTextReaderPtr)0x10b473;
      fclose(__stream);
      pcVar4 = local_60;
      if (local_60 != (char *)0x0) {
        pxStack_80 = (xmlTextReaderPtr)0x10b485;
        unlink(local_60);
        pxStack_80 = (xmlTextReaderPtr)0x10b48d;
        free(pcVar4);
        return 0;
      }
      return 0;
    }
  }
  bVar9 = local_50 == (char *)0x0;
  pxStack_80 = (xmlTextReaderPtr)0x10b2da;
  pxVar6 = reader;
  iVar1 = xmlTextReaderRead();
  cVar8 = __stream != (FILE *)0x0 && bVar9;
  local_61 = cVar8;
  while (iVar1 == 1) {
    if (cVar8 != '\0') {
      pxStack_80 = (xmlTextReaderPtr)0x10b303;
      local_44 = xmlTextReaderNodeType(reader);
      pxStack_80 = (xmlTextReaderPtr)0x10b30f;
      uVar2 = xmlTextReaderIsEmptyElement(reader);
      pxStack_80 = (xmlTextReaderPtr)0x10b31a;
      pcVar4 = (char *)xmlTextReaderConstName(reader);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "--";
      }
      pxStack_80 = (xmlTextReaderPtr)0x10b333;
      lVar5 = xmlTextReaderConstValue(reader);
      pxStack_80 = (xmlTextReaderPtr)0x10b33e;
      uVar3 = xmlTextReaderDepth(reader);
      pxStack_80 = (xmlTextReaderPtr)0x10b349;
      local_78 = xmlTextReaderHasValue(reader);
      pxStack_80 = (xmlTextReaderPtr)0x10b36a;
      fprintf(__stream,"%d %d %s %d %d",(ulong)uVar3,(ulong)local_44,pcVar4,(ulong)uVar2);
      if (lVar5 == 0) {
        pxStack_80 = (xmlTextReaderPtr)0x10b392;
        fputc(10,__stream);
        cVar8 = local_61;
      }
      else {
        pxStack_80 = (xmlTextReaderPtr)0x10b383;
        fprintf(__stream," %s\n",lVar5);
        cVar8 = local_61;
      }
    }
    pxStack_80 = (xmlTextReaderPtr)0x10b39f;
    pxVar6 = reader;
    iVar1 = xmlTextReaderRead();
  }
  if (iVar1 != 0) {
    pxStack_80 = (xmlTextReaderPtr)0x10b3bb;
    testErrorHandler(pxVar6,"%s : failed to parse\n",local_58);
  }
  if (local_50 != (char *)0x0) {
    pxStack_80 = (xmlTextReaderPtr)0x10b3cb;
    iVar1 = xmlTextReaderIsValid();
    pcVar4 = "%s fails to validate\n";
    if (iVar1 == 1) {
      pcVar4 = "%s validates\n";
    }
    pxStack_80 = (xmlTextReaderPtr)0x10b3ec;
    testErrorHandler(reader,pcVar4,local_58);
  }
  if (__stream != (FILE *)0x0) {
    pxStack_80 = (xmlTextReaderPtr)0x10b3f9;
    fclose(__stream);
    pcVar4 = local_60;
    pxStack_80 = (xmlTextReaderPtr)0x10b40b;
    iVar1 = compareFiles(local_60,local_40);
    if (pcVar4 != (char *)0x0) {
      pxStack_80 = (xmlTextReaderPtr)0x10b41a;
      unlink(pcVar4);
      pxStack_80 = (xmlTextReaderPtr)0x10b422;
      free(pcVar4);
    }
    if (iVar1 != 0) {
      pxStack_80 = (xmlTextReaderPtr)0x10b4bd;
      fprintf(_stderr,"Result for %s failed in %s\n",local_58,local_40);
      return -1;
    }
  }
  if (local_38 == (char *)0x0) {
    return 0;
  }
  pxStack_80 = (xmlTextReaderPtr)0x10b448;
  iVar1 = compareFileMem(local_38,testErrors,testErrorsSize);
  if (iVar1 != 0) {
    pxStack_80 = (xmlTextReaderPtr)0x10b456;
    streamProcessTest_cold_3();
    return -1;
  }
  return 0;
}

Assistant:

static int
streamProcessTest(const char *filename, const char *result, const char *err,
                  xmlTextReaderPtr reader, const char *rng,
                  int options ATTRIBUTE_UNUSED) {
    int ret;
    char *temp = NULL;
    FILE *t = NULL;

    if (reader == NULL)
        return(-1);

    nb_tests++;
    if (result != NULL) {
	temp = resultFilename(filename, temp_directory, ".res");
	if (temp == NULL) {
	    fprintf(stderr, "Out of memory\n");
	    fatalError();
	}
	t = fopen(temp, "wb");
	if (t == NULL) {
	    fprintf(stderr, "Can't open temp file %s\n", temp);
	    free(temp);
	    return(-1);
	}
    }
#ifdef LIBXML_SCHEMAS_ENABLED
    if (rng != NULL) {
	ret = xmlTextReaderRelaxNGValidate(reader, rng);
	if (ret < 0) {
	    testErrorHandler(NULL, "Relax-NG schema %s failed to compile\n",
	                     rng);
	    fclose(t);
            if (temp != NULL) {
                unlink(temp);
                free(temp);
            }
	    return(0);
	}
    }
#endif
    ret = xmlTextReaderRead(reader);
    while (ret == 1) {
	if ((t != NULL) && (rng == NULL))
	    processNode(t, reader);
        ret = xmlTextReaderRead(reader);
    }
    if (ret != 0) {
        testErrorHandler(NULL, "%s : failed to parse\n", filename);
    }
    if (rng != NULL) {
        if (xmlTextReaderIsValid(reader) != 1) {
	    testErrorHandler(NULL, "%s fails to validate\n", filename);
	} else {
	    testErrorHandler(NULL, "%s validates\n", filename);
	}
    }
    if (t != NULL) {
        fclose(t);
	ret = compareFiles(temp, result);
        if (temp != NULL) {
            unlink(temp);
            free(temp);
        }
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	    return(-1);
	}
    }
    if (err != NULL) {
	ret = compareFileMem(err, testErrors, testErrorsSize);
	if (ret != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    printf("%s", testErrors);
	    return(-1);
	}
    }

    return(0);
}